

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  memory_buf_t *this_00;
  int iVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  byte bVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  char *buf_ptr_2;
  char *__s;
  long lVar14;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_01;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_02;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_03;
  format_int local_58;
  
  lVar9 = (msg->time).__d.__r / 1000000000;
  sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
  if (sVar12 == 0 || (this->cache_timestamp_).__r != lVar9) {
    this_00 = &this->cached_datetime_;
    (this->cached_datetime_).super_buffer<char>.size_ = 0;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ == 0) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00,1);
      sVar8 = (this->cached_datetime_).super_buffer<char>.size_;
      sVar12 = sVar8 + 1;
    }
    else {
      sVar12 = 1;
      sVar8 = 0;
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar12;
    pcVar2[sVar8] = '[';
    iVar1 = tm_time->tm_year;
    uVar7 = iVar1 + 0x76c;
    uVar5 = -uVar7;
    if (0 < (int)uVar7) {
      uVar5 = uVar7;
    }
    local_58.str_ = fmt::v7::format_int::format_unsigned<unsigned_int>(&local_58,uVar5);
    if (iVar1 < -0x76c) {
      local_58.str_[-1] = '-';
      local_58.str_ = local_58.str_ + -1;
    }
    lVar14 = (long)&local_58 - (long)local_58.str_;
    if (lVar14 < -0x15) goto LAB_001123cb;
    fmt::v7::detail::buffer<char>::append<char>
              (&this_00->super_buffer<char>,local_58.str_,local_58.str_ + lVar14 + 0x15);
    sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar13 = sVar12 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
    pcVar2[sVar12] = '-';
    uVar7 = tm_time->tm_mon + 1;
    if (uVar7 < 100) {
      bVar6 = (byte)((uVar7 & 0xff) / 10);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = bVar6 | 0x30;
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = (char)uVar7 + bVar6 * -10 | 0x30;
    }
    else {
      local_58.buffer_._0_8_ = ZEXT48(uVar7);
      format_str.size_ = 5;
      format_str.data_ = "{:02}";
      args.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_58;
      args.desc_ = 1;
      fmt::v7::detail::vformat_to<char>
                (&this_00->super_buffer<char>,format_str,args,(locale_ref)0x0);
    }
    sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar13 = sVar12 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
    pcVar2[sVar12] = '-';
    uVar7 = tm_time->tm_mday;
    if ((ulong)uVar7 < 100) {
      bVar6 = (byte)((uVar7 & 0xff) / 10);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = bVar6 | 0x30;
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = (char)uVar7 + bVar6 * -10 | 0x30;
    }
    else {
      format_str_00.size_ = 5;
      format_str_00.data_ = "{:02}";
      args_00.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_58;
      args_00.desc_ = 1;
      local_58.buffer_._0_8_ = (ulong)uVar7;
      fmt::v7::detail::vformat_to<char>
                (&this_00->super_buffer<char>,format_str_00,args_00,(locale_ref)0x0);
    }
    sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar13 = sVar12 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
    pcVar2[sVar12] = ' ';
    uVar7 = tm_time->tm_hour;
    if ((ulong)uVar7 < 100) {
      bVar6 = (byte)((uVar7 & 0xff) / 10);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = bVar6 | 0x30;
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = (char)uVar7 + bVar6 * -10 | 0x30;
    }
    else {
      format_str_01.size_ = 5;
      format_str_01.data_ = "{:02}";
      args_01.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_58;
      args_01.desc_ = 1;
      local_58.buffer_._0_8_ = (ulong)uVar7;
      fmt::v7::detail::vformat_to<char>
                (&this_00->super_buffer<char>,format_str_01,args_01,(locale_ref)0x0);
    }
    sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar13 = sVar12 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
    pcVar2[sVar12] = ':';
    uVar7 = tm_time->tm_min;
    if ((ulong)uVar7 < 100) {
      bVar6 = (byte)((uVar7 & 0xff) / 10);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = bVar6 | 0x30;
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = (char)uVar7 + bVar6 * -10 | 0x30;
    }
    else {
      format_str_02.size_ = 5;
      format_str_02.data_ = "{:02}";
      args_02.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_58;
      args_02.desc_ = 1;
      local_58.buffer_._0_8_ = (ulong)uVar7;
      fmt::v7::detail::vformat_to<char>
                (&this_00->super_buffer<char>,format_str_02,args_02,(locale_ref)0x0);
    }
    sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar13 = sVar12 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
    pcVar2[sVar12] = ':';
    uVar7 = tm_time->tm_sec;
    if ((ulong)uVar7 < 100) {
      bVar6 = (byte)((uVar7 & 0xff) / 10);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = bVar6 | 0x30;
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
        (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
        sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
        uVar13 = sVar12 + 1;
      }
      pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
      (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
      pcVar2[sVar12] = (char)uVar7 + bVar6 * -10 | 0x30;
    }
    else {
      format_str_03.size_ = 5;
      format_str_03.data_ = "{:02}";
      args_03.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_58;
      args_03.desc_ = 1;
      local_58.buffer_._0_8_ = (ulong)uVar7;
      fmt::v7::detail::vformat_to<char>
                (&this_00->super_buffer<char>,format_str_03,args_03,(locale_ref)0x0);
    }
    sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
    uVar13 = sVar12 + 1;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar13) {
      (**(this->cached_datetime_).super_buffer<char>._vptr_buffer)(this_00);
      sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
      uVar13 = sVar12 + 1;
    }
    pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
    (this->cached_datetime_).super_buffer<char>.size_ = uVar13;
    pcVar2[sVar12] = '.';
    (this->cache_timestamp_).__r = lVar9;
    sVar12 = (this->cached_datetime_).super_buffer<char>.size_;
  }
  pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
  fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar2,pcVar2 + sVar12);
  lVar9 = (msg->time).__d.__r;
  auVar3 = SEXT816(lVar9) * SEXT816(0x112e0be826d694b3);
  auVar4 = SEXT816(lVar9) * SEXT816(0x431bde82d7b634db);
  fmt_helper::pad3<unsigned_int>
            (((int)(auVar3._8_8_ >> 0x1a) - (auVar3._12_4_ >> 0x1f)) * -1000 +
             ((int)(auVar4._8_8_ >> 0x12) - (auVar4._12_4_ >> 0x1f)),dest);
  sVar12 = (dest->super_buffer<char>).size_;
  uVar13 = sVar12 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar13) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar13;
  (dest->super_buffer<char>).ptr_[sVar12] = ']';
  sVar12 = (dest->super_buffer<char>).size_;
  uVar13 = sVar12 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar13) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar13;
  (dest->super_buffer<char>).ptr_[sVar12] = ' ';
  if ((msg->logger_name).size_ != 0) {
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar13) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar12 = (dest->super_buffer<char>).size_;
      uVar13 = sVar12 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar13;
    (dest->super_buffer<char>).ptr_[sVar12] = '[';
    pcVar2 = (msg->logger_name).data_;
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,pcVar2,pcVar2 + (msg->logger_name).size_);
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar13) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar12 = (dest->super_buffer<char>).size_;
      uVar13 = sVar12 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar13;
    (dest->super_buffer<char>).ptr_[sVar12] = ']';
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar13) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar12 = (dest->super_buffer<char>).size_;
      uVar13 = sVar12 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar13;
    (dest->super_buffer<char>).ptr_[sVar12] = ' ';
  }
  sVar12 = (dest->super_buffer<char>).size_;
  uVar13 = sVar12 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar13) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar13;
  (dest->super_buffer<char>).ptr_[sVar12] = '[';
  msg->color_range_start = (dest->super_buffer<char>).size_;
  lVar9 = (ulong)msg->level * 0x10;
  fmt::v7::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,*(char **)(level::level_string_views + lVar9),
             *(char **)(level::level_string_views + lVar9) +
             *(long *)(level::level_string_views + lVar9 + 8));
  sVar12 = (dest->super_buffer<char>).size_;
  msg->color_range_end = sVar12;
  uVar13 = sVar12 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar13) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar13;
  (dest->super_buffer<char>).ptr_[sVar12] = ']';
  sVar12 = (dest->super_buffer<char>).size_;
  uVar13 = sVar12 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar13) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar13;
  (dest->super_buffer<char>).ptr_[sVar12] = ' ';
  if ((msg->source).line != 0) {
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar13) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar12 = (dest->super_buffer<char>).size_;
      uVar13 = sVar12 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar13;
    (dest->super_buffer<char>).ptr_[sVar12] = '[';
    pcVar2 = (msg->source).filename;
    pcVar10 = strrchr(pcVar2,0x2f);
    __s = pcVar10 + 1;
    if (pcVar10 == (char *)0x0) {
      __s = pcVar2;
    }
    sVar11 = strlen(__s);
    fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar11);
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar13) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar12 = (dest->super_buffer<char>).size_;
      uVar13 = sVar12 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar13;
    (dest->super_buffer<char>).ptr_[sVar12] = ':';
    uVar7 = (msg->source).line;
    uVar5 = -uVar7;
    if (0 < (int)uVar7) {
      uVar5 = uVar7;
    }
    local_58.str_ = fmt::v7::format_int::format_unsigned<unsigned_int>(&local_58,uVar5);
    if ((int)uVar7 < 0) {
      local_58.str_[-1] = '-';
      local_58.str_ = local_58.str_ + -1;
    }
    lVar9 = (long)&local_58 - (long)local_58.str_;
    if (lVar9 < -0x15) {
LAB_001123cb:
      fmt::v7::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/core.h"
                 ,0x146,"negative value");
    }
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_58.str_,local_58.str_ + lVar9 + 0x15);
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar13) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar12 = (dest->super_buffer<char>).size_;
      uVar13 = sVar12 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar13;
    (dest->super_buffer<char>).ptr_[sVar12] = ']';
    sVar12 = (dest->super_buffer<char>).size_;
    uVar13 = sVar12 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar13) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar12 = (dest->super_buffer<char>).size_;
      uVar13 = sVar12 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar13;
    (dest->super_buffer<char>).ptr_[sVar12] = ' ';
  }
  pcVar2 = (msg->payload).data_;
  fmt::v7::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,pcVar2,pcVar2 + (msg->payload).size_);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0)
        {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

        // append logger name if exists
        if (msg.logger_name.size() > 0)
        {
            dest.push_back('[');
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty())
        {
            dest.push_back('[');
            const char *filename = details::short_filename_formatter<details::null_scoped_padder>::basename(msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }